

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O1

reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> * __thiscall
density::
sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
::start_reentrant_emplace<density_tests::TestObject<128ul,8ul>,density_tests::TestObject<128ul,8ul>>
          (reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> *__return_storage_ptr__
          ,sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
           *this,TestObject<128UL,_8UL> *i_construction_params)

{
  Allocation push_data;
  Allocation local_60;
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> local_48;
  
  detail::
  SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
            (&local_60,
             (SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
              *)this,1,true,0x80,8);
  local_60.m_control_block[1].m_next =
       (uintptr_t)
       detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<128ul,8ul>>
       ::s_table;
  density_tests::TestObject<128UL,_8UL>::TestObject
            ((TestObject<128UL,_8UL> *)local_60.m_user_storage,i_construction_params);
  local_48.m_put.m_control_block = local_60.m_control_block;
  local_48.m_put.m_next_ptr = local_60.m_next_ptr;
  (__return_storage_ptr__->m_put).m_user_storage = local_60.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_60.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_60.m_next_ptr;
  __return_storage_ptr__->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)this;
  local_48.m_put.m_user_storage = (void *)0x0;
  local_48.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)this;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::~reentrant_put_transaction
            (&local_48);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = Base::template try_inplace_allocate_impl<
              detail::LfQueue_Throwing,
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return reentrant_put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }